

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O3

bool __thiscall FpgaIO::PromGetStatus(FpgaIO *this,uint32_t *status,PromType type)

{
  BasePort *pBVar1;
  bool bVar2;
  int iVar3;
  nodeaddr_t nVar4;
  
  nVar4 = GetPromAddress(this,type,true);
  pBVar1 = (this->super_BoardIO).port;
  iVar3 = (*pBVar1->_vptr_BasePort[0x24])
                    (pBVar1,(ulong)(this->super_BoardIO).BoardId,nVar4,0x5000000);
  if ((char)iVar3 != '\0') {
    (*((this->super_BoardIO).port)->_vptr_BasePort[0x2c])();
    bVar2 = PromGetResult(this,status,type);
    return bVar2;
  }
  return false;
}

Assistant:

bool FpgaIO::PromGetStatus(uint32_t &status, PromType type)
{
    quadlet_t data = 0x05000000;
    nodeaddr_t address = GetPromAddress(type, true);

    bool ret = port->WriteQuadlet(BoardId, address, data);
    if (ret) {
        port->PromDelay();
        // Should be ready by now...
        ret = PromGetResult(status, type);
    }
    return ret;
}